

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O1

uint32 __thiscall Clasp::SolverParams::prepare(SolverParams *this)

{
  SolverStrategies SVar1;
  uint uVar2;
  
  SVar1 = this->super_SolverStrategies;
  uVar2 = 0;
  if ((((ulong)SVar1 >> 0x33 & 1) != 0) && (uVar2 = 0, (SVar1._4_4_ & 7) - 1 < 4)) {
    this->super_SolverStrategies =
         (SolverStrategies)((ulong)SVar1 & 0xfffffff8ffffffff | 0x600000000);
    uVar2 = 1;
  }
  SVar1 = this->super_SolverStrategies;
  if (((ulong)SVar1 & 0x700000000) == 0x500000000) {
    if (2 < (*(uint *)&this->field_0x18 >> 0x10 & 3) - 1) {
      uVar2 = uVar2 | 2;
      *(uint *)&this->field_0x18 = *(uint *)&this->field_0x18 & 0xfffcffff | 0x10000;
    }
    *(uint *)&this->field_0x18 = (uint)*(ushort *)&this->field_0x1a << 0x10;
  }
  if ((((ulong)SVar1 & 0x700000000) != 0x400000000) && (0xffffff < *(uint *)&this->heuristic)) {
    uVar2 = uVar2 | 4;
    *(uint *)&this->heuristic = *(uint *)&this->heuristic & 0xffffff;
  }
  if (((ulong)SVar1 & 0x8000000000000) != 0) {
    this->super_SolverStrategies =
         (SolverStrategies)((ulong)SVar1 & 0xfffbf80700000000 | 0x60000000000);
  }
  return uVar2;
}

Assistant:

uint32 SolverParams::prepare() {
	uint32 res = 0;
	if (search == SolverStrategies::no_learning && Heuristic_t::isLookback(heuId)) {
		heuId = Heuristic_t::None;
		res  |= 1;
	}
	if (heuId == Heuristic_t::Unit) {
		if (!Lookahead::isType(lookType)) { res |= 2; lookType = Var_t::Atom; }
		lookOps = 0;
	}
	if (heuId != Heuristic_t::Domain && (heuristic.domPref || heuristic.domMod)) {
		res |= 4;
		heuristic.domPref= 0;
		heuristic.domMod = 0;
	}
	SolverStrategies::prepare();
	return res;
}